

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::InitializeAppend(ColumnData *this,ColumnAppendState *state)

{
  ColumnSegmentTree *this_00;
  ColumnSegment *pCVar1;
  SegmentLock l;
  unique_lock<std::mutex> uStack_28;
  
  this_00 = &this->data;
  ::std::unique_lock<std::mutex>::unique_lock
            (&uStack_28,&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock);
  pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegmentInternal
                     (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>);
  if (pCVar1 == (ColumnSegment *)0x0) {
    AppendTransientSegment(this,(SegmentLock *)&uStack_28,this->start);
  }
  pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetLastSegment
                     (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,
                      (SegmentLock *)&uStack_28);
  if ((pCVar1->segment_type == PERSISTENT) ||
     (((pCVar1->function)._M_data)->init_append == (compression_init_append_t)0x0)) {
    AppendTransientSegment
              (this,(SegmentLock *)&uStack_28,
               (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i +
               (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start);
    pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetLastSegment
                       (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,
                        (SegmentLock *)&uStack_28);
  }
  state->current = pCVar1;
  ColumnSegment::InitializeAppend(pCVar1,state);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void ColumnData::InitializeAppend(ColumnAppendState &state) {
	auto l = data.Lock();
	if (data.IsEmpty(l)) {
		// no segments yet, append an empty segment
		AppendTransientSegment(l, start);
	}
	auto segment = data.GetLastSegment(l);
	if (segment->segment_type == ColumnSegmentType::PERSISTENT || !segment->GetCompressionFunction().init_append) {
		// we cannot append to this segment - append a new segment
		auto total_rows = segment->start + segment->count;
		AppendTransientSegment(l, total_rows);
		state.current = data.GetLastSegment(l);
	} else {
		state.current = segment;
	}

	D_ASSERT(state.current->segment_type == ColumnSegmentType::TRANSIENT);
	state.current->InitializeAppend(state);
	D_ASSERT(state.current->GetCompressionFunction().append);
}